

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderXFB.cpp
# Opt level: O2

GLuint __thiscall
glcts::TessellationShaderXFB::createSeparableProgram
          (TessellationShaderXFB *this,GLenum shader_type,uint n_strings,char **strings,
          uint n_varyings,char **varyings,bool should_succeed)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  GLuint sh1_shader_id;
  deUint32 dVar3;
  GLuint po_id;
  undefined4 extraout_var;
  TestError *pTVar5;
  GLuint GVar6;
  string shader_source;
  undefined1 local_1b0 [384];
  long lVar4;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  sh1_shader_id = (**(code **)(lVar4 + 0x3f0))(shader_type);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glCreateShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                  ,0xc5);
  po_id = (**(code **)(lVar4 + 0x3c8))();
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glCreateProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                  ,0xc9);
  (**(code **)(lVar4 + 0x1058))(po_id,0x8258,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glProgramParameteri() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                  ,0xcd);
  if (n_varyings != 0) {
    (**(code **)(lVar4 + 0x14c8))(po_id,n_varyings,varyings,0x8c8d);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glTransformFeedbackVaryings() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                    ,0xd3);
  }
  GVar6 = 0;
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,po_id,sh1_shader_id,n_strings,strings,(bool *)0x0);
  (**(code **)(lVar4 + 0x470))(sh1_shader_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glDeleteShader() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                  ,0xda);
  if (bVar1) {
    GVar6 = po_id;
    if (!should_succeed) {
      TestCaseBase::getShaderSource_abi_cxx11_
                (&shader_source,&this->super_TestCaseBase,sh1_shader_id);
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"Shader source:\n\n");
      std::operator<<((ostream *)this_00,(string *)&shader_source);
      std::operator<<((ostream *)this_00,"\n\n");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Separable program should have failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                 ,0xed);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else {
    (**(code **)(lVar4 + 0x448))(po_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glDeleteProgram() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                    ,0xdf);
    if (should_succeed) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Separable program should have succeeded",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                 ,0xe4);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return GVar6;
}

Assistant:

glw::GLuint TessellationShaderXFB::createSeparableProgram(glw::GLenum shader_type, unsigned int n_strings,
														  const char* const* strings, unsigned int n_varyings,
														  const char* const* varyings, bool should_succeed)
{
	const glw::Functions& gl	= m_context.getRenderContext().getFunctions();
	glw::GLuint			  po_id = 0;
	glw::GLuint			  so_id = 0;

	/* Create a shader object */
	so_id = gl.createShader(shader_type);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() failed");

	/* Create a program object */
	po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed");

	/* Mark the program object as separable */
	gl.programParameteri(po_id, GL_PROGRAM_SEPARABLE, GL_TRUE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glProgramParameteri() call failed");

	/* Configure XFB for the program object */
	if (n_varyings != 0)
	{
		gl.transformFeedbackVaryings(po_id, n_varyings, varyings, GL_SEPARATE_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed");
	}

	bool build_success = buildProgram(po_id, so_id, n_strings, strings);

	/* Safe to delete the shader object at this point */
	gl.deleteShader(so_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteShader() call failed");

	if (!build_success)
	{
		gl.deleteProgram(po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteProgram() call failed");
		po_id = 0;

		if (should_succeed)
		{
			TCU_FAIL("Separable program should have succeeded");
		}
	}
	else if (!should_succeed)
	{
		std::string shader_source = getShaderSource(so_id);
		m_testCtx.getLog() << tcu::TestLog::Message << "Shader source:\n\n"
						   << shader_source << "\n\n"
						   << tcu::TestLog::EndMessage;
		TCU_FAIL("Separable program should have failed");
	}

	return po_id;
}